

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O0

uint8_t rfc5497_timetlv_encode(uint64_t decoded)

{
  undefined1 auVar1 [16];
  char cVar2;
  uint32_t b;
  uint32_t a;
  uint64_t decoded_local;
  
  if (decoded == 0) {
    decoded_local._7_1_ = '\0';
  }
  else if (decoded < 0xdac00001) {
    cVar2 = '\n';
    _b = decoded;
    if (decoded < 1000) {
      for (; _b < 1000; _b = _b << 1) {
        cVar2 = cVar2 + -1;
      }
    }
    else {
      for (; 0x753 < _b; _b = _b + 1 >> 1) {
        cVar2 = cVar2 + '\x01';
      }
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = _b - 0x36c;
    decoded_local._7_1_ = SUB161(auVar1 / ZEXT816(0x7d),0) + cVar2 * '\b';
  }
  else {
    decoded_local._7_1_ = 0xff;
  }
  return decoded_local._7_1_;
}

Assistant:

uint8_t
rfc5497_timetlv_encode(uint64_t decoded) {
  uint32_t a, b;
  /*
   * t = (1 + a/8) * 2^b * 1000 / 1024
   *   = (1000 + 125 * a) * (2^b / 2^10)
   *   = (1000 + 125 * a) * 2 ^ (b-10)
   */

  if (decoded < RFC5497_TIMETLV_MIN) {
    return 0;
  }
  if (decoded > RFC5497_TIMETLV_MAX) {
    return 255;
  }

  b = 10;
  if (decoded >= 1000) {
    /* this means b >= 10 */
    while (decoded > 1875) {
      b++;

      /* divide by 2 and round up */
      decoded++;
      decoded >>= 1;
    }
  }
  else { /* decoded < 1000 */
    /* b < 10 */
    while (decoded < 1000) {
      b--;
      decoded <<= 1;
    }
  }

  a = (decoded - 1000 + 124) / 125;
  return a + (b << 3);
}